

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O1

void Opal_Sample(Opal *self,int16_t *left,int16_t *right)

{
  short sVar1;
  short sVar2;
  int16_t iVar3;
  int16_t iVar4;
  short sVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint16_t uVar12;
  int iVar13;
  OpalOperator *pOVar14;
  int16_t in_R9W;
  uint32_t phase_step;
  long lVar15;
  int iVar16;
  int iVar17;
  
  iVar17 = self->SampleRate;
  iVar16 = self->SampleAccum;
  do {
    if (iVar16 < iVar17) {
      lVar9 = ((long)(iVar17 / 2) + (long)iVar16 * 0x10000) / (long)iVar17;
      lVar15 = -0x80000000;
      if (-0x80000000 < lVar9) {
        lVar15 = lVar9;
      }
      if (0x7ffffffe < lVar15) {
        lVar15 = 0x7fffffff;
      }
      iVar8 = ((int)self->CurrOutput[0] - (int)self->LastOutput[0]) * (int)lVar15;
      iVar17 = iVar8 + 0xffff;
      if (-1 < iVar8) {
        iVar17 = iVar8;
      }
      *left = (short)((uint)iVar17 >> 0x10) + self->LastOutput[0];
      iVar8 = ((int)self->CurrOutput[1] - (int)self->LastOutput[1]) * (int)lVar15;
      iVar17 = iVar8 + 0xffff;
      if (-1 < iVar8) {
        iVar17 = iVar8;
      }
      *right = (short)((uint)iVar17 >> 0x10) + self->LastOutput[1];
      self->SampleAccum = iVar16 + 0xc234;
      return;
    }
    *(undefined4 *)self->LastOutput = *(undefined4 *)self->CurrOutput;
    lVar15 = 0x5e;
    iVar16 = 0;
    iVar17 = 0;
    do {
      if (*(int *)((long)self->LastOutput + lVar15 + -0x16) == 0) {
        iVar8 = 0;
        iVar13 = 0;
      }
      else {
        lVar9 = *(long *)((long)self->LastOutput + lVar15 + -0x36);
        uVar6 = *(ushort *)(lVar9 + 0x1698);
        if ((uVar6 & 3) == 0) {
          uVar7 = 0;
        }
        else {
          uVar10 = ((*(ushort *)((long)self->LastOutput + lVar15 + -0x2e) >> 7 & 7) >>
                   (*(int *)(lVar9 + 0x16a4) == 0)) >> ((byte)uVar6 & 1);
          uVar7 = -uVar10;
          if ((uVar6 & 4) == 0) {
            uVar7 = uVar10;
          }
          uVar7 = uVar7 & 0xffff;
        }
        lVar9 = *(long *)((long)self->LastOutput + lVar15 + -0x1e);
        phase_step = (uint32_t)
                     (short)(uVar7 << (*(byte *)((long)self->LastOutput + lVar15 + -0x2c) & 0x1f));
        if (lVar9 == 0) {
          sVar5 = *(short *)((long)self->LastOutput + lVar15 + -0x22);
          sVar2 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x56),
                                      (uint16_t)
                                      *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                      phase_step,0,
                                      *(int16_t *)((long)self->LastOutput + lVar15 + -0x24),in_R9W);
          pOVar14 = *(OpalOperator **)((long)self->LastOutput + lVar15 + -0x4e);
          uVar12 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a);
          if (sVar5 != 0) {
            sVar5 = OpalOperator_Output(pOVar14,uVar12,phase_step,0,0,in_R9W);
            goto LAB_001491ef;
          }
LAB_0014927b:
          sVar2 = OpalOperator_Output(pOVar14,uVar12,phase_step,sVar2,0,in_R9W);
        }
        else {
          sVar5 = *(short *)(lVar9 + 0x34);
          sVar1 = *(short *)((long)self->LastOutput + lVar15 + -0x22);
          sVar2 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x56),
                                      (uint16_t)
                                      *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                      phase_step,0,
                                      *(int16_t *)((long)self->LastOutput + lVar15 + -0x24),in_R9W);
          pOVar14 = *(OpalOperator **)((long)self->LastOutput + lVar15 + -0x4e);
          uVar12 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a);
          if (sVar5 == 0) {
            if (sVar1 == 0) {
              iVar3 = OpalOperator_Output(pOVar14,uVar12,phase_step,sVar2,0,in_R9W);
              sVar2 = OpalOperator_Output(*(OpalOperator **)
                                           ((long)self->LastOutput + lVar15 + -0x46),
                                          (uint16_t)
                                          *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                          phase_step,iVar3,0,in_R9W);
              pOVar14 = *(OpalOperator **)((long)self->LastOutput + lVar15 + -0x3e);
              uVar12 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a);
              goto LAB_0014927b;
            }
            iVar3 = OpalOperator_Output(pOVar14,uVar12,phase_step,0,0,in_R9W);
            iVar3 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x46),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                        phase_step,iVar3,0,in_R9W);
            sVar5 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x3e),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                        phase_step,iVar3,0,in_R9W);
LAB_001491ef:
            sVar2 = sVar2 + sVar5;
          }
          else if (sVar1 == 0) {
            iVar3 = OpalOperator_Output(pOVar14,uVar12,phase_step,sVar2,0,in_R9W);
            iVar4 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x46),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                        phase_step,0,0,in_R9W);
            iVar4 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x3e),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                        phase_step,iVar4,0,in_R9W);
            sVar2 = iVar4 + iVar3;
          }
          else {
            iVar3 = OpalOperator_Output(pOVar14,uVar12,phase_step,0,0,in_R9W);
            iVar3 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x46),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                        phase_step,iVar3,0,in_R9W);
            iVar4 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar15 + -0x3e),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar15 + -0x2a),
                                        phase_step,0,0,in_R9W);
            sVar2 = iVar4 + sVar2 + iVar3;
          }
        }
        iVar13 = *(int *)((long)self->LastOutput + lVar15 + -0x12);
        iVar11 = (int)sVar2;
        if (iVar13 != 0) {
          iVar13 = iVar11;
        }
        iVar13 = (uint)*(ushort *)((long)self->LastOutput + lVar15 + -10) * iVar13;
        iVar8 = iVar13 + 0xffff;
        if (-1 < iVar13) {
          iVar8 = iVar13;
        }
        iVar8 = iVar8 >> 0x10;
        if (*(int *)((long)self->LastOutput + lVar15 + -0xe) == 0) {
          iVar11 = 0;
        }
        iVar11 = (uint)*(ushort *)((long)self->LastOutput + lVar15 + -8) * iVar11;
        iVar13 = iVar11 + 0xffff;
        if (-1 < iVar11) {
          iVar13 = iVar11;
        }
        iVar13 = iVar13 >> 0x10;
      }
      iVar16 = iVar16 + iVar13;
      iVar17 = iVar17 + iVar8;
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x5fe);
    if (0x7ffe < iVar17) {
      iVar17 = 0x7fff;
    }
    if (iVar17 < -0x7fff) {
      iVar17 = -0x8000;
    }
    if (0x7ffe < iVar16) {
      iVar16 = 0x7fff;
    }
    self->CurrOutput[0] = (int16_t)iVar17;
    if (iVar16 < -0x7fff) {
      iVar16 = -0x8000;
    }
    self->CurrOutput[1] = (int16_t)iVar16;
    self->Clock = self->Clock + 1;
    uVar10 = ((self->TremoloClock + 1) / 0x3480) * -0x3480 + (uint)self->TremoloClock + 1;
    self->TremoloClock = (uint16_t)uVar10;
    uVar7 = 0x3480 - uVar10;
    if (uVar10 < 0x1a40) {
      uVar7 = uVar10;
    }
    self->TremoloLevel = (uint16_t)(uVar7 >> 8);
    if (self->TremoloDepth == 0) {
      self->TremoloLevel = (uint16_t)(uVar7 >> 10);
    }
    uVar6 = self->VibratoTick + 1;
    self->VibratoTick = uVar6;
    if (0x3ff < uVar6) {
      self->VibratoTick = 0;
      self->VibratoClock = (short)*(undefined4 *)&self->VibratoClock + 1U & 7;
    }
    iVar17 = self->SampleRate;
    iVar16 = self->SampleAccum - iVar17;
    self->SampleAccum = iVar16;
  } while( true );
}

Assistant:

void Opal_Sample(Opal *self, int16_t* left, int16_t* right)
{
    int32_t fract;

    /* If the destination sample rate is higher than the OPL3 sample rate, we need to skip ahead */
    while(self->SampleAccum >= self->SampleRate)
    {
        self->LastOutput[0] = self->CurrOutput[0];
        self->LastOutput[1] = self->CurrOutput[1];

        Opal_Output(self, &self->CurrOutput[0], &self->CurrOutput[1]);

        self->SampleAccum -= self->SampleRate;
    }

    /* Mix with the partial accumulation */
    fract = s_opal_MulDivR(self->SampleAccum, 65536, self->SampleRate);
    *left = (int16_t)(self->LastOutput[0] + ((fract * (self->CurrOutput[0] - self->LastOutput[0])) / 65536));
    *right = (int16_t)(self->LastOutput[1] + ((fract * (self->CurrOutput[1] - self->LastOutput[1])) / 65536));

    self->SampleAccum += OpalOPL3SampleRate;
}